

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3RefillIndex(Parse *pParse,Index *pIndex,int memRootPage)

{
  ushort uVar1;
  int iCur;
  uint uVar2;
  Table *pTab;
  sqlite3 *psVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vdbe *p;
  Op *pOVar9;
  int iVar10;
  int regOut;
  Schema **ppSVar11;
  ulong uVar12;
  int local_68;
  int iPartIdxLabel;
  KeyInfo *local_38;
  
  pTab = pIndex->pTable;
  iCur = pParse->nTab;
  pParse->nTab = iCur + 2;
  psVar3 = pParse->db;
  if (pIndex->pSchema == (Schema *)0x0) {
    uVar12 = 0xfff0bdc0;
  }
  else {
    uVar2 = psVar3->nDb;
    if ((int)uVar2 < 1) {
      uVar12 = 0;
    }
    else {
      ppSVar11 = &psVar3->aDb->pSchema;
      uVar12 = 0;
      do {
        if (*ppSVar11 == pIndex->pSchema) goto LAB_0016550d;
        uVar12 = uVar12 + 1;
        ppSVar11 = ppSVar11 + 4;
      } while (uVar2 != uVar12);
      uVar12 = (ulong)uVar2;
    }
  }
LAB_0016550d:
  iVar7 = (int)uVar12;
  iVar5 = sqlite3AuthCheck(pParse,0x1b,pIndex->zName,(char *)0x0,psVar3->aDb[iVar7].zDbSName);
  if (iVar5 == 0) {
    sqlite3TableLock(pParse,iVar7,pTab->tnum,'\x01',pTab->zName);
    p = pParse->pVdbe;
    if (p == (Vdbe *)0x0) {
      p = allocVdbe(pParse);
    }
    if (p != (Vdbe *)0x0) {
      local_68 = memRootPage;
      if (memRootPage < 0) {
        local_68 = pIndex->tnum;
      }
      local_38 = sqlite3KeyInfoOfIndex(pParse,pIndex);
      iVar5 = pParse->nTab;
      pParse->nTab = iVar5 + 1;
      uVar1 = pIndex->nKeyCol;
      if (local_38 != (KeyInfo *)0x0) {
        local_38->nRef = local_38->nRef + 1;
      }
      iVar6 = sqlite3VdbeAddOp3(p,0x6d,iVar5,0,(uint)uVar1);
      sqlite3VdbeChangeP4(p,iVar6,(char *)local_38,-9);
      sqlite3OpenTable(pParse,iCur,iVar7,pTab,0x68);
      iVar6 = sqlite3VdbeAddOp3(p,0x25,iCur,0,0);
      if (pParse->nTempReg == '\0') {
        regOut = pParse->nMem + 1;
        pParse->nMem = regOut;
      }
      else {
        bVar4 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar4;
        regOut = pParse->aTempReg[bVar4];
      }
      sqlite3GenerateIndexKey(pParse,pIndex,iCur,regOut,0,&iPartIdxLabel,(Index *)0x0,0);
      sqlite3VdbeAddOp3(p,0x7d,iVar5,regOut,0);
      sqlite3ResolvePartIdxLabel(pParse,iPartIdxLabel);
      sqlite3VdbeAddOp3(p,7,iCur,iVar6 + 1,0);
      if (p->db->mallocFailed == '\0') {
        iVar8 = p->nOp + -1;
        if (-1 < iVar6) {
          iVar8 = iVar6;
        }
        pOVar9 = p->aOp + iVar8;
      }
      else {
        pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      iVar6 = iCur + 1;
      pOVar9->p2 = p->nOp;
      if (memRootPage < 0) {
        sqlite3VdbeAddOp3(p,0x83,local_68,iVar7,0);
      }
      iVar7 = sqlite3VdbeAddOp3(p,0x69,iVar6,local_68,iVar7);
      sqlite3VdbeChangeP4(p,iVar7,(char *)local_38,-9);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (ushort)(-1 < memRootPage) * 0x10 + 1;
      }
      iVar8 = sqlite3VdbeAddOp3(p,0x23,iVar5,0,0);
      iVar7 = p->nOp;
      if (pIndex->onError != '\0') {
        iVar10 = iVar7 + 3;
        sqlite3VdbeAddOp3(p,0xd,0,iVar10,0);
        iVar7 = p->nOp;
        uVar1 = pIndex->nKeyCol;
        iVar10 = sqlite3VdbeAddOp3(p,0x78,iVar5,iVar10,regOut);
        if (p->db->mallocFailed == '\0') {
          pOVar9 = p->aOp;
          pOVar9[iVar10].p4type = -3;
          *(uint *)&pOVar9[iVar10].p4 = (uint)uVar1;
        }
        sqlite3UniqueConstraint(pParse,2,pIndex);
      }
      sqlite3VdbeAddOp3(p,0x79,iVar5,regOut,iVar6);
      sqlite3VdbeAddOp3(p,0x21,iVar6,0,-1);
      sqlite3VdbeAddOp3(p,0x7e,iVar6,regOut,0);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 0x10;
      }
      sqlite3ReleaseTempReg(pParse,regOut);
      sqlite3VdbeAddOp3(p,3,iVar5,iVar7,0);
      if (p->db->mallocFailed == '\0') {
        iVar7 = p->nOp + -1;
        if (-1 < iVar8) {
          iVar7 = iVar8;
        }
        pOVar9 = p->aOp + iVar7;
      }
      else {
        pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar9->p2 = p->nOp;
      sqlite3VdbeAddOp3(p,0x70,iCur,0,0);
      sqlite3VdbeAddOp3(p,0x70,iVar6,0,0);
      sqlite3VdbeAddOp3(p,0x70,iVar5,0,0);
    }
  }
  return;
}

Assistant:

static void sqlite3RefillIndex(Parse *pParse, Index *pIndex, int memRootPage){
  Table *pTab = pIndex->pTable;  /* The table that is indexed */
  int iTab = pParse->nTab++;     /* Btree cursor used for pTab */
  int iIdx = pParse->nTab++;     /* Btree cursor used for pIndex */
  int iSorter;                   /* Cursor opened by OpenSorter (if in use) */
  int addr1;                     /* Address of top of loop */
  int addr2;                     /* Address to jump to for next iteration */
  int tnum;                      /* Root page of index */
  int iPartIdxLabel;             /* Jump to this label to skip a row */
  Vdbe *v;                       /* Generate code into this virtual machine */
  KeyInfo *pKey;                 /* KeyInfo for index */
  int regRecord;                 /* Register holding assembled index record */
  sqlite3 *db = pParse->db;      /* The database connection */
  int iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_REINDEX, pIndex->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

  /* Require a write-lock on the table to perform this operation */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);

  v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  if( memRootPage>=0 ){
    tnum = memRootPage;
  }else{
    tnum = pIndex->tnum;
  }
  pKey = sqlite3KeyInfoOfIndex(pParse, pIndex);
  assert( pKey!=0 || db->mallocFailed || pParse->nErr );

  /* Open the sorter cursor if we are to use one. */
  iSorter = pParse->nTab++;
  sqlite3VdbeAddOp4(v, OP_SorterOpen, iSorter, 0, pIndex->nKeyCol, (char*)
                    sqlite3KeyInfoRef(pKey), P4_KEYINFO);

  /* Open the table. Loop through all rows of the table, inserting index
  ** records into the sorter. */
  sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
  addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, 0); VdbeCoverage(v);
  regRecord = sqlite3GetTempReg(pParse);

  sqlite3GenerateIndexKey(pParse,pIndex,iTab,regRecord,0,&iPartIdxLabel,0,0);
  sqlite3VdbeAddOp2(v, OP_SorterInsert, iSorter, regRecord);
  sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
  sqlite3VdbeAddOp2(v, OP_Next, iTab, addr1+1); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);
  if( memRootPage<0 ) sqlite3VdbeAddOp2(v, OP_Clear, tnum, iDb);
  sqlite3VdbeAddOp4(v, OP_OpenWrite, iIdx, tnum, iDb, 
                    (char *)pKey, P4_KEYINFO);
  sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR|((memRootPage>=0)?OPFLAG_P2ISREG:0));

  addr1 = sqlite3VdbeAddOp2(v, OP_SorterSort, iSorter, 0); VdbeCoverage(v);
  if( IsUniqueIndex(pIndex) ){
    int j2 = sqlite3VdbeCurrentAddr(v) + 3;
    sqlite3VdbeGoto(v, j2);
    addr2 = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp4Int(v, OP_SorterCompare, iSorter, j2, regRecord,
                         pIndex->nKeyCol); VdbeCoverage(v);
    sqlite3UniqueConstraint(pParse, OE_Abort, pIndex);
  }else{
    addr2 = sqlite3VdbeCurrentAddr(v);
  }
  sqlite3VdbeAddOp3(v, OP_SorterData, iSorter, regRecord, iIdx);
  sqlite3VdbeAddOp3(v, OP_Last, iIdx, 0, -1);
  sqlite3VdbeAddOp2(v, OP_IdxInsert, iIdx, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3VdbeAddOp2(v, OP_SorterNext, iSorter, addr2); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);

  sqlite3VdbeAddOp1(v, OP_Close, iTab);
  sqlite3VdbeAddOp1(v, OP_Close, iIdx);
  sqlite3VdbeAddOp1(v, OP_Close, iSorter);
}